

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::createRowwisePartitioned
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  HighsInt HVar6;
  vector<double,_std::allocator<double>_> *this_02;
  HighsInt iCol;
  ulong uVar7;
  pointer piVar8;
  ulong uVar9;
  long lVar10;
  pointer pdVar11;
  int iVar12;
  pointer piVar13;
  ulong uVar14;
  pointer pdVar15;
  size_type __n;
  vector<int,_std::allocator<int>_> ar_end;
  value_type_conflict2 local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  uVar2 = matrix->num_col_;
  uVar3 = matrix->num_row_;
  __n = (size_type)(int)uVar3;
  HVar6 = numNz(matrix);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,__n + 1);
  this_00 = &this->p_end_;
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,__n,&local_4c);
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_4c);
  this_01 = &this->index_;
  this_02 = &this->value_;
  piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    if (in_partition == (int8_t *)0x0) {
      piVar8 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_00362e8f:
      piVar13 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar10 = (long)piVar4[uVar7]; lVar10 < piVar4[uVar7 + 1]; lVar10 = lVar10 + 1) {
        piVar1 = piVar13 + piVar8[lVar10];
        *piVar1 = *piVar1 + 1;
      }
    }
    else {
      piVar8 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (in_partition[uVar7] != '\0') goto LAB_00362e8f;
      for (lVar10 = (long)piVar4[uVar7]; lVar10 < piVar4[uVar7 + 1]; lVar10 = lVar10 + 1) {
        local_48._M_impl.super__Vector_impl_data._M_start[piVar8[lVar10]] =
             local_48._M_impl.super__Vector_impl_data._M_start[piVar8[lVar10]] + 1;
      }
    }
  }
  piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar4 = 0;
  piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar12 = 0;
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    iVar12 = iVar12 + piVar8[uVar14] + local_48._M_impl.super__Vector_impl_data._M_start[uVar14];
    piVar4[uVar14 + 1] = iVar12;
  }
  piVar8 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
    local_48._M_impl.super__Vector_impl_data._M_start[uVar14] = piVar8[uVar14] + piVar4[uVar14];
    piVar8[uVar14] = piVar4[uVar14];
  }
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)HVar6);
  std::vector<double,_std::allocator<double>_>::resize(this_02,(long)HVar6);
  piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  do {
    if (uVar7 == uVar9) {
      this->format_ = kRowwisePartitioned;
      this->num_col_ = uVar2;
      this->num_row_ = uVar3;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      return;
    }
    if (in_partition == (int8_t *)0x0) {
      piVar8 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar13 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
LAB_00362fbe:
      piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar10 = (long)piVar4[uVar7]; lVar10 < piVar4[uVar7 + 1]; lVar10 = lVar10 + 1) {
        iVar12 = piVar5[piVar8[lVar10]];
        piVar5[piVar8[lVar10]] = iVar12 + 1;
        piVar13[iVar12] = (int)uVar7;
        pdVar15[iVar12] = pdVar11[lVar10];
      }
    }
    else {
      piVar8 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar13 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (in_partition[uVar7] != '\0') goto LAB_00362fbe;
      for (lVar10 = (long)piVar4[uVar7]; lVar10 < piVar4[uVar7 + 1]; lVar10 = lVar10 + 1) {
        iVar12 = local_48._M_impl.super__Vector_impl_data._M_start[piVar8[lVar10]];
        local_48._M_impl.super__Vector_impl_data._M_start[piVar8[lVar10]] = iVar12 + 1;
        piVar13[iVar12] = (int)uVar7;
        pdVar15[iVar12] = pdVar11[lVar10];
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void HighsSparseMatrix::createRowwisePartitioned(
    const HighsSparseMatrix& matrix, const int8_t* in_partition) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  const bool all_in_partition = in_partition == NULL;

  HighsInt num_col = matrix.num_col_;
  HighsInt num_row = matrix.num_row_;
  HighsInt num_nz = matrix.numNz();
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& ar_start = this->start_;
  vector<HighsInt>& ar_p_end = this->p_end_;
  vector<HighsInt>& ar_index = this->index_;
  vector<double>& ar_value = this->value_;

  // Use ar_p_end and ar_end to compute lengths, which are then transformed into
  // the p_ends and ends of the inserted entries
  std::vector<HighsInt> ar_end;
  ar_start.resize(num_row + 1);
  ar_p_end.assign(num_row, 0);
  ar_end.assign(num_row, 0);
  // Count the nonzeros of nonbasic and basic columns in each row
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (all_in_partition || in_partition[iCol]) {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        ar_p_end[iRow]++;
      }
    } else {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        ar_end[iRow]++;
      }
    }
  }
  // Compute the starts and turn the lengths into ends
  ar_start[0] = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    ar_start[iRow + 1] = ar_start[iRow] + ar_p_end[iRow] + ar_end[iRow];
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    ar_end[iRow] = ar_start[iRow] + ar_p_end[iRow];
    ar_p_end[iRow] = ar_start[iRow];
  }
  // Insert the entries
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (all_in_partition || in_partition[iCol]) {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        HighsInt iToEl = ar_p_end[iRow]++;
        ar_index[iToEl] = iCol;
        ar_value[iToEl] = a_value[iEl];
      }
    } else {
      for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
        HighsInt iRow = a_index[iEl];
        HighsInt iToEl = ar_end[iRow]++;
        ar_index[iToEl] = iCol;
        ar_value[iToEl] = a_value[iEl];
      }
    }
  }
  this->format_ = MatrixFormat::kRowwisePartitioned;
  this->num_col_ = num_col;
  this->num_row_ = num_row;
}